

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

SGDOptimizer * __thiscall CoreML::Specification::SGDOptimizer::New(SGDOptimizer *this,Arena *arena)

{
  SGDOptimizer *this_00;
  
  this_00 = (SGDOptimizer *)operator_new(0x30);
  SGDOptimizer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SGDOptimizer>(arena,this_00);
  }
  return this_00;
}

Assistant:

SGDOptimizer* SGDOptimizer::New(::google::protobuf::Arena* arena) const {
  SGDOptimizer* n = new SGDOptimizer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}